

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AnalysisLoad(sqlite3 *db,int iDb)

{
  long lVar1;
  Table *pzErrMsg;
  char *pcVar2;
  int in_ESI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  Index *pIdx_1;
  Index *pIdx;
  Table *pTab;
  Table *pStat1;
  Schema *pSchema;
  int rc;
  char *zSql;
  HashElem *i;
  analysisInfo sInfo;
  void *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  Index *in_stack_ffffffffffffffa0;
  sqlite3 *in_stack_ffffffffffffffa8;
  Schema *pArg;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  sqlite3 *db_00;
  HashElem *pHVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  pArg = in_RDI->aDb[in_ESI].pSchema;
  for (pHVar4 = (pArg->tblHash).first; pHVar4 != (HashElem *)0x0; pHVar4 = pHVar4->next) {
    in_stack_ffffffffffffffa8 = (sqlite3 *)pHVar4->data;
    *(uint *)&in_stack_ffffffffffffffa8->flags = (uint)in_stack_ffffffffffffffa8->flags & 0xffffffef
    ;
  }
  for (db_00 = (sqlite3 *)(pArg->idxHash).first; db_00 != (sqlite3 *)0x0;
      db_00 = (sqlite3 *)db_00->pVfs) {
    in_stack_ffffffffffffffa0 = (Index *)db_00->pDfltColl;
    *(ushort *)&in_stack_ffffffffffffffa0->field_0x63 =
         *(ushort *)&in_stack_ffffffffffffffa0->field_0x63 & 0xff7f;
  }
  pcVar2 = in_RDI->aDb[in_ESI].zDbSName;
  pzErrMsg = sqlite3FindTable(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                              in_stack_ffffffffffffff98);
  if ((pzErrMsg != (Table *)0x0) && (pzErrMsg->eTabType == '\0')) {
    pcVar2 = sqlite3MPrintf(in_RDI,"SELECT tbl,idx,stat FROM %Q.sqlite_stat1",pcVar2);
    if (pcVar2 == (char *)0x0) {
      iVar3 = 7;
    }
    else {
      iVar3 = sqlite3_exec(db_00,pcVar2,(sqlite3_callback)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                           pArg,&pzErrMsg->zName);
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
    }
  }
  for (pHVar4 = (pArg->idxHash).first; pHVar4 != (HashElem *)0x0; pHVar4 = pHVar4->next) {
    if ((*(ushort *)((long)pHVar4->data + 99) >> 7 & 1) == 0) {
      sqlite3DefaultRowEst(in_stack_ffffffffffffffa0);
    }
  }
  if (iVar3 == 7) {
    sqlite3OomFault((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3AnalysisLoad(sqlite3 *db, int iDb){
  analysisInfo sInfo;
  HashElem *i;
  char *zSql;
  int rc = SQLITE_OK;
  Schema *pSchema = db->aDb[iDb].pSchema;
  const Table *pStat1;

  assert( iDb>=0 && iDb<db->nDb );
  assert( db->aDb[iDb].pBt!=0 );

  /* Clear any prior statistics */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&pSchema->tblHash); i; i=sqliteHashNext(i)){
    Table *pTab = sqliteHashData(i);
    pTab->tabFlags &= ~TF_HasStat1;
  }
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    pIdx->hasStat1 = 0;
#ifdef SQLITE_ENABLE_STAT4
    sqlite3DeleteIndexSamples(db, pIdx);
    pIdx->aSample = 0;
#endif
  }

  /* Load new statistics out of the sqlite_stat1 table */
  sInfo.db = db;
  sInfo.zDatabase = db->aDb[iDb].zDbSName;
  if( (pStat1 = sqlite3FindTable(db, "sqlite_stat1", sInfo.zDatabase))
   && IsOrdinaryTable(pStat1)
  ){
    zSql = sqlite3MPrintf(db,
        "SELECT tbl,idx,stat FROM %Q.sqlite_stat1", sInfo.zDatabase);
    if( zSql==0 ){
      rc = SQLITE_NOMEM_BKPT;
    }else{
      rc = sqlite3_exec(db, zSql, analysisLoader, &sInfo, 0);
      sqlite3DbFree(db, zSql);
    }
  }

  /* Set appropriate defaults on all indexes not in the sqlite_stat1 table */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    if( !pIdx->hasStat1 ) sqlite3DefaultRowEst(pIdx);
  }

  /* Load the statistics from the sqlite_stat4 table. */
#ifdef SQLITE_ENABLE_STAT4
  if( rc==SQLITE_OK ){
    DisableLookaside;
    rc = loadStat4(db, sInfo.zDatabase);
    EnableLookaside;
  }
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    sqlite3_free(pIdx->aiRowEst);
    pIdx->aiRowEst = 0;
  }
#endif

  if( rc==SQLITE_NOMEM ){
    sqlite3OomFault(db);
  }
  return rc;
}